

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search_utils.h
# Opt level: O3

int64_t intra_model_rd(AV1_COMMON *cm,MACROBLOCK *x,int plane,BLOCK_SIZE plane_bsize,TX_SIZE tx_size
                      ,int use_hadamard)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int cols;
  int rows;
  int iVar4;
  int iVar5;
  undefined7 in_register_00000009;
  int blk_row;
  int64_t iVar6;
  undefined7 in_register_00000081;
  BitDepthInfo bd_info;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  int blk_col;
  macroblock_plane *pmVar10;
  
  uVar7 = CONCAT71(in_register_00000009,plane_bsize) & 0xffffffff;
  bVar1 = block_size_wide[uVar7];
  iVar2 = (x->e_mbd).mb_to_right_edge;
  uVar8 = (uint)bVar1;
  if (iVar2 < 0) {
    uVar8 = (iVar2 >> ((char)(x->e_mbd).plane[(uint)plane].subsampling_x + 3U & 0x1f)) + uVar8;
  }
  uVar9 = (uint)block_size_high[uVar7];
  iVar2 = (x->e_mbd).mb_to_bottom_edge;
  if (iVar2 < 0) {
    uVar9 = (uint)block_size_high[uVar7] +
            (iVar2 >> ((char)(x->e_mbd).plane[(uint)plane].subsampling_y + 3U & 0x1f));
  }
  if ((int)uVar9 >> 2 < 1) {
    iVar6 = 0;
  }
  else {
    blk_row = 0;
    uVar7 = (ulong)(uint)((int)CONCAT71(in_register_00000081,tx_size) * 4);
    bd_info = (BitDepthInfo)
              (CONCAT44((uint)((x->e_mbd).cur_buf)->flags >> 3,(x->e_mbd).bd) & 0x1ffffffff);
    iVar2 = *(int *)((long)tx_size_high_unit + uVar7);
    iVar3 = *(int *)((long)tx_size_wide_unit + uVar7);
    cols = *(int *)((long)tx_size_wide + uVar7);
    rows = *(int *)((long)tx_size_high + uVar7);
    pmVar10 = x->plane + (uint)plane;
    iVar6 = 0;
    do {
      if (0 < (int)uVar8 >> 2) {
        blk_col = 0;
        do {
          av1_predict_intra_block_facade(cm,&x->e_mbd,plane,blk_col,blk_row,tx_size);
          iVar5 = (pmVar10->src).stride;
          iVar4 = (x->e_mbd).plane[(uint)plane].dst.stride;
          av1_subtract_block(bd_info,rows,cols,pmVar10->src_diff,(ulong)bVar1,
                             (pmVar10->src).buf + (iVar5 * blk_row + blk_col) * 4,(long)iVar5,
                             (x->e_mbd).plane[(uint)plane].dst.buf + (iVar4 * blk_row + blk_col) * 4
                             ,(long)iVar4);
          av1_quick_txfm(use_hadamard,tx_size,bd_info,pmVar10->src_diff,(uint)bVar1,pmVar10->coeff);
          iVar5 = (*aom_satd)(pmVar10->coeff,
                              tx_size_2d[CONCAT71(in_register_00000081,tx_size) & 0xffffffff]);
          iVar6 = iVar6 + iVar5;
          blk_col = blk_col + iVar3;
        } while (blk_col < (int)uVar8 >> 2);
      }
      blk_row = blk_row + iVar2;
    } while (blk_row < (int)uVar9 >> 2);
  }
  return iVar6;
}

Assistant:

static int64_t intra_model_rd(const AV1_COMMON *cm, MACROBLOCK *const x,
                              int plane, BLOCK_SIZE plane_bsize,
                              TX_SIZE tx_size, int use_hadamard) {
  MACROBLOCKD *const xd = &x->e_mbd;
  const BitDepthInfo bd_info = get_bit_depth_info(xd);
  int row, col;
  assert(!is_inter_block(xd->mi[0]));
  const int stepr = tx_size_high_unit[tx_size];
  const int stepc = tx_size_wide_unit[tx_size];
  const int txbw = tx_size_wide[tx_size];
  const int txbh = tx_size_high[tx_size];
  const int max_blocks_wide = max_block_wide(xd, plane_bsize, plane);
  const int max_blocks_high = max_block_high(xd, plane_bsize, plane);
  int64_t satd_cost = 0;
  struct macroblock_plane *p = &x->plane[plane];
  struct macroblockd_plane *pd = &xd->plane[plane];
  // Prediction.
  for (row = 0; row < max_blocks_high; row += stepr) {
    for (col = 0; col < max_blocks_wide; col += stepc) {
      av1_predict_intra_block_facade(cm, xd, plane, col, row, tx_size);
      // Here we use p->src_diff and p->coeff as temporary buffers for
      // prediction residue and transform coefficients. The buffers are only
      // used in this for loop, therefore we don't need to properly add offset
      // to the buffers.
      av1_subtract_block(
          bd_info, txbh, txbw, p->src_diff, block_size_wide[plane_bsize],
          p->src.buf + (((row * p->src.stride) + col) << 2), p->src.stride,
          pd->dst.buf + (((row * pd->dst.stride) + col) << 2), pd->dst.stride);
      av1_quick_txfm(use_hadamard, tx_size, bd_info, p->src_diff,
                     block_size_wide[plane_bsize], p->coeff);
      satd_cost += aom_satd(p->coeff, tx_size_2d[tx_size]);
    }
  }
  return satd_cost;
}